

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O3

void TIFFSwabArrayOfFloat(float *fp,tmsize_t n)

{
  float fVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  if (0 < n) {
    uVar6 = n + 1;
    do {
      fVar1 = *fp;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  (byte)((uint)fVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar1 >> 0x10),fVar1)) >>
                                                  0x20),fVar1) >> 0x18),
                                                  CONCAT12((char)((uint)fVar1 >> 8),SUB42(fVar1,0)))
                                           >> 0x10),SUB42(fVar1,0)) & 0xffff00ff00ff00ff;
      auVar7 = pshuflw(auVar7,auVar7,0x1b);
      sVar2 = auVar7._0_2_;
      sVar3 = auVar7._2_2_;
      sVar4 = auVar7._4_2_;
      sVar5 = auVar7._6_2_;
      *fp = (float)CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar7[6] - (0xff < sVar5),
                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar7[4] - (0xff < sVar4),
                                     CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar7[2] -
                                              (0xff < sVar3),
                                              (0 < sVar2) * (sVar2 < 0x100) * auVar7[0] -
                                              (0xff < sVar2))));
      fp = fp + 1;
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

void TIFFSwabArrayOfFloat(register float *fp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(float) == 4);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)fp;
        t = cp[3];
        cp[3] = cp[0];
        cp[0] = t;
        t = cp[2];
        cp[2] = cp[1];
        cp[1] = t;
        fp++;
    }
}